

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O0

void btSolveL1(btScalar *L,btScalar *B,int n,int lskip1)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  int j;
  int i;
  int lskip3;
  int lskip2;
  btScalar *ell;
  btScalar *ex;
  btScalar p4;
  btScalar p3;
  btScalar p2;
  btScalar q1;
  btScalar p1;
  btScalar Z41;
  btScalar Z31;
  btScalar Z21;
  btScalar Z11;
  int lskip1_local;
  int n_local;
  btScalar *B_local;
  btScalar *L_local;
  
  iVar11 = lskip1 * 2;
  iVar12 = lskip1 * 3;
  for (i = 0; i <= n + -4; i = i + 4) {
    Z11 = 0.0;
    Z21 = 0.0;
    Z31 = 0.0;
    Z41 = 0.0;
    ell = L + i * lskip1;
    ex = B;
    iVar10 = i;
    while (j = iVar10 + -0xc, -1 < j) {
      fVar13 = *ex;
      fVar14 = ex[1];
      fVar15 = ex[2];
      fVar1 = ex[3];
      fVar2 = ex[4];
      fVar3 = ex[5];
      fVar4 = ex[6];
      fVar5 = ex[7];
      fVar6 = ex[8];
      fVar7 = ex[9];
      fVar8 = ex[10];
      fVar9 = ex[0xb];
      Z11 = ell[0xb] * fVar9 +
            ell[10] * fVar8 +
            ell[9] * fVar7 +
            ell[8] * fVar6 +
            ell[7] * fVar5 +
            ell[6] * fVar4 +
            ell[5] * fVar3 +
            ell[4] * fVar2 +
            ell[3] * fVar1 + ell[2] * fVar15 + ell[1] * fVar14 + *ell * fVar13 + Z11;
      Z21 = ell[lskip1 + 0xb] * fVar9 +
            ell[lskip1 + 10] * fVar8 +
            ell[lskip1 + 9] * fVar7 +
            ell[lskip1 + 8] * fVar6 +
            ell[lskip1 + 7] * fVar5 +
            ell[lskip1 + 6] * fVar4 +
            ell[lskip1 + 5] * fVar3 +
            ell[lskip1 + 4] * fVar2 +
            ell[lskip1 + 3] * fVar1 +
            ell[lskip1 + 2] * fVar15 + ell[lskip1 + 1] * fVar14 + ell[lskip1] * fVar13 + Z21;
      Z31 = ell[iVar11 + 0xb] * fVar9 +
            ell[iVar11 + 10] * fVar8 +
            ell[iVar11 + 9] * fVar7 +
            ell[iVar11 + 8] * fVar6 +
            ell[iVar11 + 7] * fVar5 +
            ell[iVar11 + 6] * fVar4 +
            ell[iVar11 + 5] * fVar3 +
            ell[iVar11 + 4] * fVar2 +
            ell[iVar11 + 3] * fVar1 +
            ell[iVar11 + 2] * fVar15 + ell[iVar11 + 1] * fVar14 + ell[iVar11] * fVar13 + Z31;
      Z41 = ell[iVar12 + 0xb] * fVar9 +
            ell[iVar12 + 10] * fVar8 +
            ell[iVar12 + 9] * fVar7 +
            ell[iVar12 + 8] * fVar6 +
            ell[iVar12 + 7] * fVar5 +
            ell[iVar12 + 6] * fVar4 +
            ell[iVar12 + 5] * fVar3 +
            ell[iVar12 + 4] * fVar2 +
            ell[iVar12 + 3] * fVar1 +
            ell[iVar12 + 2] * fVar15 + ell[iVar12 + 1] * fVar14 + ell[iVar12] * fVar13 + Z41;
      ell = ell + 0xc;
      ex = ex + 0xc;
      iVar10 = j;
    }
    while (j = iVar10, 0 < j) {
      fVar13 = *ex;
      Z11 = *ell * fVar13 + Z11;
      Z21 = ell[lskip1] * fVar13 + Z21;
      Z31 = ell[iVar11] * fVar13 + Z31;
      Z41 = ell[iVar12] * fVar13 + Z41;
      ell = ell + 1;
      ex = ex + 1;
      iVar10 = j + -1;
    }
    fVar13 = *ex - Z11;
    *ex = fVar13;
    fVar14 = -ell[lskip1] * fVar13 + (ex[1] - Z21);
    ex[1] = fVar14;
    fVar15 = -ell[iVar11 + 1] * fVar14 + -ell[iVar11] * fVar13 + (ex[2] - Z31);
    ex[2] = fVar15;
    ex[3] = -ell[iVar12 + 2] * fVar15 +
            -ell[iVar12 + 1] * fVar14 + -ell[iVar12] * fVar13 + (ex[3] - Z41);
  }
  for (; i < n; i = i + 1) {
    Z11 = 0.0;
    ell = L + i * lskip1;
    ex = B;
    iVar11 = i;
    while (j = iVar11 + -0xc, -1 < j) {
      Z11 = ell[0xb] * ex[0xb] +
            ell[10] * ex[10] +
            ell[9] * ex[9] +
            ell[8] * ex[8] +
            ell[7] * ex[7] +
            ell[6] * ex[6] +
            ell[5] * ex[5] +
            ell[4] * ex[4] + ell[3] * ex[3] + ell[2] * ex[2] + ell[1] * ex[1] + *ell * *ex + Z11;
      ell = ell + 0xc;
      ex = ex + 0xc;
      iVar11 = j;
    }
    while (j = iVar11, 0 < j) {
      Z11 = *ell * *ex + Z11;
      ell = ell + 1;
      ex = ex + 1;
      iVar11 = j + -1;
    }
    *ex = *ex - Z11;
  }
  return;
}

Assistant:

void btSolveL1 (const btScalar *L, btScalar *B, int n, int lskip1)
{  
  /* declare variables - Z matrix, p and q vectors, etc */
  btScalar Z11,Z21,Z31,Z41,p1,q1,p2,p3,p4,*ex;
  const btScalar *ell;
  int lskip2,lskip3,i,j;
  /* compute lskip values */
  lskip2 = 2*lskip1;
  lskip3 = 3*lskip1;
  /* compute all 4 x 1 blocks of X */
  for (i=0; i <= n-4; i+=4) {
    /* compute all 4 x 1 block of X, from rows i..i+4-1 */
    /* set the Z matrix to 0 */
    Z11=0;
    Z21=0;
    Z31=0;
    Z41=0;
    ell = L + i*lskip1;
    ex = B;
    /* the inner loop that computes outer products and adds them to Z */
    for (j=i-12; j >= 0; j -= 12) {
      /* load p and q values */
      p1=ell[0];
      q1=ex[0];
      p2=ell[lskip1];
      p3=ell[lskip2];
      p4=ell[lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[1];
      q1=ex[1];
      p2=ell[1+lskip1];
      p3=ell[1+lskip2];
      p4=ell[1+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[2];
      q1=ex[2];
      p2=ell[2+lskip1];
      p3=ell[2+lskip2];
      p4=ell[2+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[3];
      q1=ex[3];
      p2=ell[3+lskip1];
      p3=ell[3+lskip2];
      p4=ell[3+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[4];
      q1=ex[4];
      p2=ell[4+lskip1];
      p3=ell[4+lskip2];
      p4=ell[4+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[5];
      q1=ex[5];
      p2=ell[5+lskip1];
      p3=ell[5+lskip2];
      p4=ell[5+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[6];
      q1=ex[6];
      p2=ell[6+lskip1];
      p3=ell[6+lskip2];
      p4=ell[6+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[7];
      q1=ex[7];
      p2=ell[7+lskip1];
      p3=ell[7+lskip2];
      p4=ell[7+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[8];
      q1=ex[8];
      p2=ell[8+lskip1];
      p3=ell[8+lskip2];
      p4=ell[8+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[9];
      q1=ex[9];
      p2=ell[9+lskip1];
      p3=ell[9+lskip2];
      p4=ell[9+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[10];
      q1=ex[10];
      p2=ell[10+lskip1];
      p3=ell[10+lskip2];
      p4=ell[10+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[11];
      q1=ex[11];
      p2=ell[11+lskip1];
      p3=ell[11+lskip2];
      p4=ell[11+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* advance pointers */
      ell += 12;
      ex += 12;
      /* end of inner loop */
    }
    /* compute left-over iterations */
    j += 12;
    for (; j > 0; j--) {
      /* load p and q values */
      p1=ell[0];
      q1=ex[0];
      p2=ell[lskip1];
      p3=ell[lskip2];
      p4=ell[lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* advance pointers */
      ell += 1;
      ex += 1;
    }
    /* finish computing the X(i) block */
    Z11 = ex[0] - Z11;
    ex[0] = Z11;
    p1 = ell[lskip1];
    Z21 = ex[1] - Z21 - p1*Z11;
    ex[1] = Z21;
    p1 = ell[lskip2];
    p2 = ell[1+lskip2];
    Z31 = ex[2] - Z31 - p1*Z11 - p2*Z21;
    ex[2] = Z31;
    p1 = ell[lskip3];
    p2 = ell[1+lskip3];
    p3 = ell[2+lskip3];
    Z41 = ex[3] - Z41 - p1*Z11 - p2*Z21 - p3*Z31;
    ex[3] = Z41;
    /* end of outer loop */
  }
  /* compute rows at end that are not a multiple of block size */
  for (; i < n; i++) {
    /* compute all 1 x 1 block of X, from rows i..i+1-1 */
    /* set the Z matrix to 0 */
    Z11=0;
    ell = L + i*lskip1;
    ex = B;
    /* the inner loop that computes outer products and adds them to Z */
    for (j=i-12; j >= 0; j -= 12) {
      /* load p and q values */
      p1=ell[0];
      q1=ex[0];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[1];
      q1=ex[1];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[2];
      q1=ex[2];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[3];
      q1=ex[3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[4];
      q1=ex[4];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[5];
      q1=ex[5];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[6];
      q1=ex[6];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[7];
      q1=ex[7];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[8];
      q1=ex[8];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[9];
      q1=ex[9];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[10];
      q1=ex[10];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[11];
      q1=ex[11];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* advance pointers */
      ell += 12;
      ex += 12;
      /* end of inner loop */
    }
    /* compute left-over iterations */
    j += 12;
    for (; j > 0; j--) {
      /* load p and q values */
      p1=ell[0];
      q1=ex[0];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* advance pointers */
      ell += 1;
      ex += 1;
    }
    /* finish computing the X(i) block */
    Z11 = ex[0] - Z11;
    ex[0] = Z11;
  }
}